

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initManifestTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  VcprojGenerator *pVVar8;
  bool bVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  ProString tmplt;
  VcprojGenerator *local_a8;
  VcprojGenerator *local_a0;
  undefined1 local_98 [56];
  Data *pDStack_60;
  QString *local_58;
  undefined1 *puStack_50;
  char *local_48;
  undefined1 *puStack_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_98,"TEMPLATE");
  QMakeEvaluator::first
            ((ProString *)(local_98 + 0x30),&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
  if ((VcprojGenerator *)local_98._0_8_ != (VcprojGenerator *)0x0) {
    LOCK();
    *(int *)&(((Win32MakefileGenerator *)local_98._0_8_)->super_MakefileGenerator).
             super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo =
         *(int *)&(((Win32MakefileGenerator *)local_98._0_8_)->super_MakefileGenerator).
                  super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(((Win32MakefileGenerator *)local_98._0_8_)->super_MakefileGenerator).
                 super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  bVar3 = ProString::operator==((ProString *)(local_98 + 0x30),"vclib");
  pVVar8 = this;
  if (bVar3) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar10.m_data = (storage_type *)0x12;
    QVar10.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar10);
    local_a0 = (VcprojGenerator *)local_98._0_8_;
    config.m_data = (storage_type_conflict *)local_98._8_8_;
    config.m_size = local_98._16_8_;
    bVar4 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    bVar2 = 0;
    if (!bVar4) {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      pVVar8 = (VcprojGenerator *)local_98;
      QVar11.m_data = (storage_type *)0x6;
      QVar11.m_size = (qsizetype)pVVar8;
      QString::fromUtf8(QVar11);
      local_a8 = (VcprojGenerator *)local_98._0_8_;
      config_00.m_data = (storage_type_conflict *)local_98._8_8_;
      config_00.m_size = local_98._16_8_;
      bVar5 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
      bVar7 = 1;
      bVar9 = true;
      bVar4 = true;
      bVar6 = true;
      bVar2 = 1;
      if (!bVar5) goto LAB_00242533;
    }
  }
  else {
    bVar2 = 0;
  }
  bVar7 = bVar2;
  bVar4 = ProString::operator==((ProString *)(local_98 + 0x30),"vcapp");
  bVar4 = !bVar4;
  bVar9 = bVar3;
  if (bVar4) {
    bVar6 = false;
  }
  else {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar12.m_data = (storage_type *)0x12;
    QVar12.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar12);
    config_01.m_data = (storage_type_conflict *)local_98._8_8_;
    config_01.m_size = local_98._16_8_;
    bVar6 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_01,false);
    bVar6 = !bVar6;
    pVVar8 = (VcprojGenerator *)local_98._0_8_;
  }
LAB_00242533:
  if (pVVar8 != (VcprojGenerator *)0x0 && !bVar4) {
    LOCK();
    *(int *)&(pVVar8->super_Win32MakefileGenerator).super_MakefileGenerator.
             super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo =
         *(int *)&(pVVar8->super_Win32MakefileGenerator).super_MakefileGenerator.
                  super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(pVVar8->super_Win32MakefileGenerator).super_MakefileGenerator.
                 super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)pVVar8,2,0x10);
    }
  }
  if ((bool)(bVar7 & local_a8 != (VcprojGenerator *)0x0)) {
    LOCK();
    *(int *)&(local_a8->super_Win32MakefileGenerator).super_MakefileGenerator.
             super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo =
         *(int *)&(local_a8->super_Win32MakefileGenerator).super_MakefileGenerator.
                  super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(local_a8->super_Win32MakefileGenerator).super_MakefileGenerator.
                 super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
    }
  }
  if ((bVar9 & local_a0 != (VcprojGenerator *)0x0) == 1) {
    LOCK();
    *(int *)&(local_a0->super_Win32MakefileGenerator).super_MakefileGenerator.
             super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo =
         *(int *)&(local_a0->super_Win32MakefileGenerator).super_MakefileGenerator.
                  super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo + -1;
    UNLOCK();
    if (*(int *)&(local_a0->super_Win32MakefileGenerator).super_MakefileGenerator.
                 super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo == 0) {
      QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
    }
  }
  if (bVar6) {
    (this->vcProject).Configuration.manifestTool.EmbedManifest = _False;
  }
  if ((QArrayData *)local_98._48_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._48_8_,2,0x10);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initManifestTool()
{
    VCManifestTool &tool = vcProject.Configuration.manifestTool;
    const ProString tmplt = project->first("TEMPLATE");
    if ((tmplt == "vclib"
         && !project->isActiveConfig("embed_manifest_dll")
         && !project->isActiveConfig("static"))
        || (tmplt == "vcapp"
            && !project->isActiveConfig("embed_manifest_exe"))) {
        tool.EmbedManifest = _False;
    }
}